

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-reverse-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase57::run(TestCase57 *this)

{
  byte bytes [4];
  
  return;
}

Assistant:

TEST(EndianReverse, TwoBytes) {
  byte bytes[] = {0x12, 0x34, 0x56, 0x78};

  WireValue<uint16_t>* vals = reinterpret_cast<WireValue<uint16_t>*>(bytes);

  EXPECT_EQ(0x1234, vals[0].get());
  EXPECT_EQ(0x5678, vals[1].get());

  vals[0].set(0x2345);
  vals[1].set(0x6789);

  EXPECT_EQ(0x23, bytes[0]);
  EXPECT_EQ(0x45, bytes[1]);
  EXPECT_EQ(0x67, bytes[2]);
  EXPECT_EQ(0x89, bytes[3]);
}